

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O0

bool PSFFile::save(string *filename,uint8_t version,uint8_t *reserved,uint32_t reserved_size,
                  uint8_t *compressed_exe,uint32_t compressed_exe_size,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *tags)

{
  bool bVar1;
  int iVar2;
  char *__filename;
  FILE *__s;
  size_t sVar3;
  pointer ppVar4;
  istream *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 local_230;
  string local_210 [8];
  string line;
  istringstream local_1f0 [8];
  istringstream value_reader;
  string *value;
  string *key;
  _Self local_58;
  iterator it;
  uint32_t exe_crc;
  FILE *fp;
  uint8_t data [4];
  uint32_t compressed_exe_size_local;
  uint8_t *compressed_exe_local;
  uint32_t reserved_size_local;
  uint8_t *reserved_local;
  uint8_t version_local;
  string *filename_local;
  
  fp._4_4_ = compressed_exe_size;
  _data = compressed_exe;
  __filename = (char *)std::__cxx11::string::c_str();
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    filename_local._7_1_ = 0;
  }
  else {
    sVar3 = fwrite("PSF",1,3,__s);
    if (sVar3 == 3) {
      iVar2 = fputc((uint)version,__s);
      if (iVar2 == -1) {
        fclose(__s);
        filename_local._7_1_ = 0;
      }
      else {
        fp._0_1_ = (undefined1)reserved_size;
        fp._1_1_ = (undefined1)(reserved_size >> 8);
        fp._2_1_ = (undefined1)(reserved_size >> 0x10);
        fp._3_1_ = (undefined1)(reserved_size >> 0x18);
        sVar3 = fwrite(&fp,1,4,__s);
        if (sVar3 == 4) {
          fp._0_1_ = (undefined1)fp._4_4_;
          fp._1_1_ = (undefined1)(fp._4_4_ >> 8);
          fp._2_1_ = (undefined1)(fp._4_4_ >> 0x10);
          fp._3_1_ = (undefined1)(fp._4_4_ >> 0x18);
          sVar3 = fwrite(&fp,1,4,__s);
          if (sVar3 == 4) {
            if (_data == (uint8_t *)0x0) {
              local_230 = 0;
            }
            else {
              local_230 = crc32(0,_data,fp._4_4_);
            }
            it._M_node._4_4_ = local_230;
            fp._0_1_ = (undefined1)local_230;
            fp._1_1_ = (undefined1)((uint)local_230 >> 8);
            fp._2_1_ = (undefined1)((uint)local_230 >> 0x10);
            fp._3_1_ = (undefined1)((uint)local_230 >> 0x18);
            sVar3 = fwrite(&fp,1,4,__s);
            if (sVar3 == 4) {
              if (((reserved == (uint8_t *)0x0) || (reserved_size == 0)) ||
                 (sVar3 = fwrite(reserved,1,(ulong)reserved_size,__s), sVar3 == reserved_size)) {
                if (((_data == (uint8_t *)0x0) || (fp._4_4_ == 0)) ||
                   (sVar3 = fwrite(_data,1,(ulong)fp._4_4_,__s), sVar3 == fp._4_4_)) {
                  bVar1 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::empty(tags);
                  if (!bVar1) {
                    sVar3 = fwrite("[TAG]",1,5,__s);
                    if (sVar3 != 5) {
                      fclose(__s);
                      filename_local._7_1_ = 0;
                      goto LAB_0010d4cc;
                    }
                    local_58._M_node =
                         (_Base_ptr)
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::begin(tags);
                    while( true ) {
                      key = (string *)
                            std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::end(tags);
                      bVar1 = std::operator!=(&local_58,(_Self *)&key);
                      if (!bVar1) break;
                      std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator->(&local_58);
                      ppVar4 = std::
                               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator->(&local_58);
                      std::__cxx11::istringstream::istringstream(local_1f0,&ppVar4->second,8);
                      std::__cxx11::string::string(local_210);
                      do {
                        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                           ((istream *)local_1f0,local_210);
                        bVar1 = std::ios::operator_cast_to_bool
                                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
                        if (!bVar1) {
                          bVar1 = false;
                          goto LAB_0010d487;
                        }
                        uVar6 = std::__cxx11::string::c_str();
                        uVar7 = std::__cxx11::string::c_str();
                        iVar2 = fprintf(__s,"%s=%s\n",uVar6,uVar7);
                      } while (-1 < iVar2);
                      fclose(__s);
                      filename_local._7_1_ = 0;
                      bVar1 = true;
LAB_0010d487:
                      std::__cxx11::string::~string(local_210);
                      std::__cxx11::istringstream::~istringstream(local_1f0);
                      if (bVar1) goto LAB_0010d4cc;
                      std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator++(&local_58);
                    }
                  }
                  fclose(__s);
                  filename_local._7_1_ = 1;
                }
                else {
                  fclose(__s);
                  filename_local._7_1_ = 0;
                }
              }
              else {
                fclose(__s);
                filename_local._7_1_ = 0;
              }
            }
            else {
              fclose(__s);
              filename_local._7_1_ = 0;
            }
          }
          else {
            fclose(__s);
            filename_local._7_1_ = 0;
          }
        }
        else {
          fclose(__s);
          filename_local._7_1_ = 0;
        }
      }
    }
    else {
      fclose(__s);
      filename_local._7_1_ = 0;
    }
  }
LAB_0010d4cc:
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

bool PSFFile::save(const std::string& filename, uint8_t version, const uint8_t * reserved, uint32_t reserved_size, const uint8_t * compressed_exe, uint32_t compressed_exe_size, std::map<std::string, std::string> tags)
{
	uint8_t data[4];

	FILE * fp = fopen(filename.c_str(), "wb");
	if (fp == NULL)
	{
		return false;
	}

	// signature
	if (fwrite(PSF_SIGNATURE, 1, PSF_SIGNATURE_SIZE, fp) != PSF_SIGNATURE_SIZE)
	{
		fclose(fp);
		return false;
	}

	// version
	if (fputc(version, fp) == EOF)
	{
		fclose(fp);
		return false;
	}

	// size of reserved area
	data[0] = reserved_size & 0xff;
	data[1] = (reserved_size >> 8) & 0xff;
	data[2] = (reserved_size >> 16) & 0xff;
	data[3] = (reserved_size >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// size of program area
	data[0] = compressed_exe_size & 0xff;
	data[1] = (compressed_exe_size >> 8) & 0xff;
	data[2] = (compressed_exe_size >> 16) & 0xff;
	data[3] = (compressed_exe_size >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// crc32 of program area
	uint32_t exe_crc = (compressed_exe != NULL) ? crc32(0L, compressed_exe, compressed_exe_size) : 0;
	data[0] = exe_crc & 0xff;
	data[1] = (exe_crc >> 8) & 0xff;
	data[2] = (exe_crc >> 16) & 0xff;
	data[3] = (exe_crc >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// reserved area
	if (reserved != NULL && reserved_size != 0)
	{
		if (fwrite(reserved, 1, reserved_size, fp) != reserved_size)
		{
			fclose(fp);
			return false;
		}
	}

	// program area
	if (compressed_exe != NULL && compressed_exe_size != 0)
	{
		if (fwrite(compressed_exe, 1, compressed_exe_size, fp) != compressed_exe_size)
		{
			fclose(fp);
			return false;
		}
	}

	// tags
	if (!tags.empty())
	{
		if (fwrite(PSF_TAG_MARKER, 1, PSF_TAG_MARKER_SIZE, fp) != PSF_TAG_MARKER_SIZE)
		{
			fclose(fp);
			return false;
		}

		for (std::map<std::string, std::string>::iterator it = tags.begin(); it != tags.end(); ++it)
		{
			const std::string& key = it->first;
			const std::string& value = it->second;
			std::istringstream value_reader(value);
			std::string line;

			// process for each lines
			while (std::getline(value_reader, line))
			{
				if (fprintf(fp, "%s=%s\n", key.c_str(), line.c_str()) < 0)
				{
					fclose(fp);
					return false;
				}
			}
		}
	}

	fclose(fp);
	return true;
}